

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# g_text.c
# Opt level: O0

int text_click(t_gobj *z,_glist *glist,int xpix,int ypix,int shift,int alt,int dbl,int doit)

{
  t_symbol *s;
  t_gotfn p_Var1;
  t_symbol *clicksym;
  t_text *x;
  int alt_local;
  int shift_local;
  int ypix_local;
  int xpix_local;
  _glist *glist_local;
  t_gobj *z_local;
  
  if (((ulong)z[2].g_next & 0x3000000000000) == 0x1000000000000) {
    s = gensym("click");
    p_Var1 = zgetfn(&z->g_pd,s);
    if (p_Var1 == (t_gotfn)0x0) {
      z_local._4_4_ = 0;
    }
    else {
      if (doit != 0) {
        pd_vmess(&z->g_pd,s,"fffff",(double)xpix,(double)ypix,(double)shift,0,(double)alt);
      }
      z_local._4_4_ = 1;
    }
  }
  else if (((ulong)z[2].g_next & 0x3000000000000) == 0x2000000000000) {
    if (doit != 0) {
      message_click((t_message *)z,(float)xpix,(float)ypix,(float)shift,0.0,(float)alt);
    }
    z_local._4_4_ = 1;
  }
  else {
    z_local._4_4_ = 0;
  }
  return z_local._4_4_;
}

Assistant:

static int text_click(t_gobj *z, struct _glist *glist,
    int xpix, int ypix, int shift, int alt, int dbl, int doit)
{
    t_text *x = (t_text *)z;
    if (x->te_type == T_OBJECT)
    {
        t_symbol *clicksym = gensym("click");
        if (zgetfn(&x->te_pd, clicksym))
        {
            if (doit)
                pd_vmess(&x->te_pd, clicksym, "fffff",
                    (double)xpix, (double)ypix,
                        (double)shift, (double)0, (double)alt);
            return (1);
        }
        else return (0);
    }
    else if (x->te_type == T_MESSAGE)
    {
        if (doit)
            message_click((t_message *)x, (t_floatarg)xpix, (t_floatarg)ypix,
                (t_floatarg)shift, (t_floatarg)0, (t_floatarg)alt);
        return (1);
    }
    else return (0);
}